

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_c.cpp
# Opt level: O3

float scnrm2(int n,complex<float> *x,int incx)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = 0.0;
  if (0 < incx && 0 < n) {
    pfVar1 = (float *)((long)&x->_M_value + 4);
    fVar2 = 1.0;
    fVar4 = 0.0;
    do {
      fVar3 = pfVar1[-1];
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        fVar3 = ABS(fVar3);
        if (fVar3 <= fVar4) {
          fVar2 = (fVar3 / fVar4) * (fVar3 / fVar4) + fVar2;
        }
        else {
          fVar2 = fVar2 * (fVar4 / fVar3) * (fVar4 / fVar3) + 1.0;
          fVar4 = fVar3;
        }
      }
      fVar3 = *pfVar1;
      if ((fVar3 != 0.0) || (NAN(fVar3))) {
        fVar3 = ABS(fVar3);
        if (fVar3 <= fVar4) {
          fVar2 = (fVar3 / fVar4) * (fVar3 / fVar4) + fVar2;
        }
        else {
          fVar2 = fVar2 * (fVar4 / fVar3) * (fVar4 / fVar3) + 1.0;
          fVar4 = fVar3;
        }
      }
      pfVar1 = pfVar1 + (ulong)(uint)incx * 2;
      n = n + -1;
    } while (n != 0);
    if (fVar2 < 0.0) {
      fVar2 = sqrtf(fVar2);
    }
    else {
      fVar2 = SQRT(fVar2);
    }
    fVar4 = fVar4 * fVar2;
  }
  return fVar4;
}

Assistant:

float scnrm2 ( int n, complex <float> x[], int incx )

//****************************************************************************80
//
//  Purpose:
//
//    SCNRM2 returns the euclidean norm of a vector.
//
//  Discussion:
//
//    This routine uses single precision complex arithmetic.
//
//    SCNRM2 := sqrt ( sum ( conjg ( x(1:n) ) * x(1:n) ) )
//            = sqrt ( dot_product ( x(1:n), x(1:n) ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    11 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Jim Bunch, Cleve Moler, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979,
//    ISBN13: 978-0-898711-72-1,
//    LC: QA214.L56.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for FORTRAN usage,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, pages 308-323, 1979.
//
//  Parameters:
//
//    Input, int N, the number of entries in the vector.
//
//    Input, complex <float> X[], the vector.
//
//    Input, int INCX, the increment between successive entries of X.
//
//    Output, float SCNRM2, the norm of the vector.
//
{
  int i;
  int ix;
  float scale;
  float ssq;
  float temp;
  float value;

  if ( n < 1 || incx < 1 )
  {
    value  = 0.0;
  }
  else
  {
    scale = 0.0;
    ssq = 1.0;
    ix = 0;

    for ( i = 0; i < n; i++ )
    {
      if ( real ( x[ix] ) != 0.0 )
      {
        temp = fabs ( real ( x[ix] ) );
        if ( scale < temp )
        {
          ssq = 1.0 + ssq * pow ( scale / temp, 2 );
          scale = temp;
        }
        else
        {
          ssq = ssq + pow ( temp / scale, 2 );
        }
      }

      if ( imag ( x[ix] ) != 0.0 )
      {
        temp = fabs ( imag ( x[ix] ) );
        if ( scale < temp )
        {
          ssq = 1.0 + ssq * pow ( scale / temp, 2 );
          scale = temp;
        }
        else
        {
          ssq = ssq + pow ( temp / scale, 2 );
        }
      }
      ix = ix + incx;
    }
    value  = scale * sqrt ( ssq );
  }
  return value;
}